

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CEDate.cpp
# Opt level: O0

double CEDate::Gregorian2JD(double gregorian)

{
  vector<double,_std::allocator<double>_> *in_XMM0_Qa;
  double dVar1;
  vector<double,_std::allocator<double>_> *unaff_retaddr;
  vector<double,_std::allocator<double>_> gregorian_vect;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffffc0;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffffe8;
  
  Gregorian2GregorianVect
            ((double)gregorian_vect.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start);
  std::vector<double,_std::allocator<double>_>::vector(unaff_retaddr,in_XMM0_Qa);
  dVar1 = GregorianVect2JD(in_stack_ffffffffffffffe8);
  std::vector<double,_std::allocator<double>_>::~vector(in_stack_ffffffffffffffc0);
  std::vector<double,_std::allocator<double>_>::~vector(in_stack_ffffffffffffffc0);
  return dVar1;
}

Assistant:

double CEDate::Gregorian2JD(double gregorian)
{
    // First convert the gregorian double into a gregorian vector
    std::vector<double> gregorian_vect = Gregorian2GregorianVect(gregorian) ;
    
    return GregorianVect2JD(gregorian_vect) ;
}